

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

int detect_transition_to_still
              (FIRSTPASS_INFO *firstpass_info,int next_stats_index,int min_gf_interval,
              int frame_interval,int still_interval,double loop_decay_rate,double last_decay_rate)

{
  uint uVar1;
  uint uVar2;
  FIRSTPASS_STATS *pFVar3;
  int iVar4;
  int iVar5;
  
  if (((min_gf_interval < frame_interval) && (0.999 <= loop_decay_rate)) && (last_decay_rate < 0.9))
  {
    uVar1 = av1_firstpass_info_future_count(firstpass_info,next_stats_index);
    uVar2 = uVar1;
    if (still_interval <= (int)uVar1) {
      iVar4 = 0;
      iVar5 = iVar4;
      if (0 < still_interval) {
        do {
          pFVar3 = av1_firstpass_info_peek(firstpass_info,next_stats_index + iVar4);
          iVar5 = iVar4;
          if (pFVar3->pcnt_inter - pFVar3->pcnt_motion < 0.999) break;
          iVar4 = iVar4 + 1;
          iVar5 = still_interval;
        } while (still_interval != iVar4);
      }
      uVar2 = (uint)(iVar5 == still_interval);
    }
    if (still_interval <= (int)uVar1) {
      return uVar2;
    }
  }
  return 0;
}

Assistant:

static int detect_transition_to_still(const FIRSTPASS_INFO *firstpass_info,
                                      int next_stats_index,
                                      const int min_gf_interval,
                                      const int frame_interval,
                                      const int still_interval,
                                      const double loop_decay_rate,
                                      const double last_decay_rate) {
  // Break clause to detect very still sections after motion
  // For example a static image after a fade or other transition
  // instead of a clean scene cut.
  if (frame_interval > min_gf_interval && loop_decay_rate >= 0.999 &&
      last_decay_rate < 0.9) {
    int stats_left =
        av1_firstpass_info_future_count(firstpass_info, next_stats_index);
    if (stats_left >= still_interval) {
      int j;
      // Look ahead a few frames to see if static condition persists...
      for (j = 0; j < still_interval; ++j) {
        const FIRSTPASS_STATS *stats =
            av1_firstpass_info_peek(firstpass_info, next_stats_index + j);
        if (stats->pcnt_inter - stats->pcnt_motion < 0.999) break;
      }
      // Only if it does do we signal a transition to still.
      return j == still_interval;
    }
  }
  return 0;
}